

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

RequiredExtensions *
deqp::gls::TextureStateQueryTests::anon_unknown_1::getQueryExtension
          (RequiredExtensions *__return_storage_ptr__,ContextType *contextType,QueryType query)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  RequiredExtensions *extraout_RAX;
  undefined7 extraout_var_01;
  RequiredExtensions *pRVar2;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  pRVar2 = (RequiredExtensions *)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    pRVar2 = (RequiredExtensions *)CONCAT71(extraout_var_00,bVar1);
    if (bVar1) {
      if ((query < QUERY_LAST) &&
         (pRVar2 = (RequiredExtensions *)(ulong)query,
         (0x33019800000U >> ((ulong)pRVar2 & 0x3f) & 1) != 0)) {
        RequiredExtensions::RequiredExtensions(__return_storage_ptr__,"GL_EXT_texture_border_clamp")
        ;
        return extraout_RAX;
      }
    }
    else {
      bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
      pRVar2 = (RequiredExtensions *)CONCAT71(extraout_var_01,bVar1);
    }
  }
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return pRVar2;
}

Assistant:

static RequiredExtensions getQueryExtension (const glu::ContextType& contextType, QueryType query)
{
	DE_ASSERT(!isCoreQuery(contextType, query));

	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::getQueryExtension(query);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::getQueryExtension(query);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::getQueryExtension(query);
	else
	{
		DE_ASSERT(false);
		return RequiredExtensions();
	}
}